

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

DynamicSize *
slang::ast::dynamicBitstreamSize
          (DynamicSize *__return_storage_ptr__,Type *type,BitstreamSizeMode mode)

{
  int iVar1;
  int iVar2;
  SymbolKind SVar3;
  Type *pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint64_t uVar9;
  bool bVar10;
  bitwidth_t bVar11;
  BitstreamSizeMode BVar12;
  Type *pTVar13;
  DynamicSize *pDVar14;
  DynamicSize *__m;
  DynamicSize *pDVar15;
  int iVar16;
  _Ct __n2;
  ClassPropertySymbol *prop;
  long lVar18;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar19;
  _Ct __m2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar20;
  DynamicSize elemSize;
  DynamicSize local_58;
  DynamicSize *local_40;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> local_38;
  ulong uVar17;
  
  bVar11 = Type::getBitWidth(type);
  if (bVar11 != 0) {
    pDVar14 = (DynamicSize *)(ulong)bVar11;
    __return_storage_ptr__->multiplier = 0;
    __return_storage_ptr__->fixed = (uint64_t)pDVar14;
LAB_002cd59b:
    __return_storage_ptr__->isValid = true;
    return pDVar14;
  }
  pTVar13 = type->canonical;
  if (pTVar13 == (Type *)0x0) {
    Type::resolveCanonical(type);
    pTVar13 = type->canonical;
  }
  if ((pTVar13->super_Symbol).kind == StringType) {
    pDVar14 = (DynamicSize *)((ulong)(mode != DestEmpty) << 3);
    __return_storage_ptr__->multiplier = (uint64_t)pDVar14;
    __return_storage_ptr__->fixed = 0;
    goto LAB_002cd59b;
  }
  bVar10 = Type::isUnpackedArray(type);
  if (bVar10) {
    pTVar13 = Type::getArrayElementType(type);
    dynamicBitstreamSize(&local_58,pTVar13,mode);
    if (local_58.isValid == false) {
      *(DynamicSize **)&__return_storage_ptr__->isValid =
           (DynamicSize *)((ulong)(uint7)local_58._17_7_ << 8);
      __return_storage_ptr__->multiplier = local_58.multiplier;
      __return_storage_ptr__->fixed = local_58.fixed;
      return (DynamicSize *)((ulong)(uint7)local_58._17_7_ << 8);
    }
    pTVar13 = type->canonical;
    if (pTVar13 == (Type *)0x0) {
      Type::resolveCanonical(type);
      pTVar13 = type->canonical;
    }
    if ((pTVar13->super_Symbol).kind == FixedSizeUnpackedArrayType) {
      iVar1 = (int)pTVar13[1].super_Symbol.name._M_len;
      iVar2 = *(int *)((long)&pTVar13[1].super_Symbol.name._M_len + 4);
      iVar16 = iVar1 - iVar2;
      if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
        iVar16 = -(iVar1 - iVar2);
      }
      uVar17 = CONCAT44(0,iVar16 + 1);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar17;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_58.fixed;
      pDVar14 = SUB168(auVar5 * auVar7,0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar17;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_58.multiplier;
      __m = SUB168(auVar6 * auVar8,0);
      pDVar15 = __m;
      if ((((SUB168(auVar6 * auVar8,8) != 0) || (SUB168(auVar5 * auVar7,8) != 0)) ||
          (pDVar15 = (DynamicSize *)0x3fffffff8, (DynamicSize *)0x3fffffff8 < __m)) ||
         ((DynamicSize *)0x3fffffff8 < pDVar14)) {
        __return_storage_ptr__->multiplier = 0;
        __return_storage_ptr__->fixed = 0;
        *(undefined8 *)&__return_storage_ptr__->isValid = 0;
        return pDVar15;
      }
      goto LAB_002cd844;
    }
    if (mode != Source) {
      if (mode == DestFill) {
        pDVar14 = (DynamicSize *)local_58.fixed;
        __m = (DynamicSize *)local_58.multiplier;
        if ((DynamicSize *)local_58.multiplier == (DynamicSize *)0x0) {
          pDVar14 = (DynamicSize *)0x0;
          __m = (DynamicSize *)local_58.fixed;
        }
        goto LAB_002cd844;
      }
      goto LAB_002cd83e;
    }
    __m = (DynamicSize *)std::__detail::__gcd<unsigned_long>(local_58.multiplier,local_58.fixed);
  }
  else {
    pTVar13 = type->canonical;
    if (pTVar13 == (Type *)0x0) {
      Type::resolveCanonical(type);
      pTVar13 = type->canonical;
    }
    SVar3 = (pTVar13->super_Symbol).kind;
    if (SVar3 == ClassType) {
      sVar20 = Scope::membersOfType<slang::ast::ClassPropertySymbol>((Scope *)(pTVar13 + 1));
      if (sVar20._M_begin.current.current != sVar20._M_end.current.current) {
        pDVar14 = (DynamicSize *)0x0;
        local_40 = (DynamicSize *)0x3fffffff9;
        __m = (DynamicSize *)0x0;
        do {
          local_38 = sVar20._M_end.current;
          sVar19 = sVar20._M_begin.current;
          pTVar13 = DeclaredType::getType((DeclaredType *)(sVar19.current + 1));
          dynamicBitstreamSize(&local_58,pTVar13,mode);
          if (local_58.isValid == false) goto LAB_002cd7fc;
          BVar12 = mode;
          if ((DynamicSize *)local_58.multiplier != (DynamicSize *)0x0) {
            BVar12 = DestEmpty;
          }
          if (mode != DestFill) {
            BVar12 = mode;
          }
          mode = BVar12;
          __m = (DynamicSize *)
                std::__detail::__gcd<unsigned_long>((unsigned_long)__m,local_58.multiplier);
          pDVar14 = (DynamicSize *)((long)(uint64_t *)local_58.fixed + (long)&pDVar14->multiplier);
          if (local_40 <= pDVar14) goto LAB_002cd7fc;
          do {
            sVar19.current = (sVar19.current)->nextInScope;
            if (sVar19.current == (Symbol *)0x0) {
              sVar19.current = (Symbol *)0x0;
              break;
            }
          } while ((sVar19.current)->kind != ClassProperty);
          sVar20._M_end.current = local_38.current;
          sVar20._M_begin.current = sVar19.current;
        } while (sVar19.current != local_38.current);
        goto LAB_002cd844;
      }
    }
    else if ((SVar3 == UnpackedStructType) && (pTVar4 = pTVar13[1].canonical, pTVar4 != (Type *)0x0)
            ) {
      local_38.current = (Symbol *)pTVar13[1].super_Symbol.originatingSyntax;
      lVar18 = 0;
      local_40 = (DynamicSize *)0x3fffffff9;
      pDVar14 = (DynamicSize *)0x0;
      __m = (DynamicSize *)0x0;
      do {
        pTVar13 = DeclaredType::getType
                            ((DeclaredType *)
                             (*(long *)((long)&(local_38.current)->kind + lVar18) + 0x40));
        dynamicBitstreamSize(&local_58,pTVar13,mode);
        uVar9 = local_58.multiplier;
        if (local_58.isValid == false) {
LAB_002cd7fc:
          __return_storage_ptr__->multiplier = 0;
          __return_storage_ptr__->fixed = 0;
          *(undefined8 *)&__return_storage_ptr__->isValid = 0;
          return __return_storage_ptr__;
        }
        __m = (DynamicSize *)
              std::__detail::__gcd<unsigned_long>((unsigned_long)__m,local_58.multiplier);
        pDVar14 = (DynamicSize *)((long)(uint64_t *)local_58.fixed + (long)&pDVar14->multiplier);
        if (local_40 <= pDVar14) goto LAB_002cd7fc;
        BVar12 = mode;
        if ((DynamicSize *)uVar9 != (DynamicSize *)0x0) {
          BVar12 = DestEmpty;
        }
        if (mode == DestFill) {
          mode = BVar12;
        }
        lVar18 = lVar18 + 8;
      } while ((long)pTVar4 << 3 != lVar18);
      goto LAB_002cd844;
    }
LAB_002cd83e:
    __m = (DynamicSize *)0x0;
  }
  pDVar14 = (DynamicSize *)0x0;
LAB_002cd844:
  __return_storage_ptr__->multiplier = (uint64_t)__m;
  __return_storage_ptr__->fixed = (uint64_t)pDVar14;
  __return_storage_ptr__->isValid = true;
  return __return_storage_ptr__;
}

Assistant:

static DynamicSize dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    uint64_t multiplier = 0;
    uint64_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0u : CHAR_BIT, 0u};

    auto handleField = [&](const ValueSymbol& field) {
        auto elemSize = dynamicBitstreamSize(field.getType(), mode);
        if (!elemSize)
            return false;

        // If a dynamically sized field is filled the rest should be empty.
        if (mode == BitstreamSizeMode::DestFill && elemSize.multiplier > 0)
            mode = BitstreamSizeMode::DestEmpty;

        multiplier = std::gcd(multiplier, elemSize.multiplier);
        fixedSize += elemSize.fixed;
        if (fixedSize > Type::MaxBitWidth)
            return false;

        return true;
    };

    if (type.isUnpackedArray()) {
        auto elemSize = dynamicBitstreamSize(*type.getArrayElementType(), mode);
        if (!elemSize)
            return elemSize;

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            auto mul = checkedMulU64(elemSize.multiplier, rw);
            auto fixed = checkedMulU64(elemSize.fixed, rw);
            if (!mul || !fixed || mul > Type::MaxBitWidth || fixed > Type::MaxBitWidth)
                return {};

            multiplier = *mul;
            fixedSize = *fixed;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!elemSize.multiplier) {
                multiplier = elemSize.fixed; // element is fixed size
            }
            else {
                multiplier = elemSize.multiplier; // element is dynamically sized
                fixedSize = elemSize.fixed;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(elemSize.multiplier, elemSize.fixed);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto field : us.fields) {
            if (!handleField(*field))
                return {};
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        SLANG_ASSERT(!ct.hasCycles());
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            if (!handleField(prop))
                return {};
        }
    }

    return {multiplier, fixedSize};
}